

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O3

void __thiscall ImGuiWS::Impl::Impl(Impl *this)

{
  _Rb_tree_header *p_Var1;
  XorRlePerDrawListWithVtxOffset *this_00;
  
  (this->nConnected).super___atomic_base<int>._M_i = 0;
  p_Var1 = &(this->dataWrite).textureIdMap._M_t._M_impl.super__Rb_tree_header;
  (this->dataWrite).textureIdMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dataWrite).textureIdMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->worker)._M_id._M_thread = 0;
  (this->mutex)._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->mutex)._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->mutex)._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->mutex)._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->mutex)._M_impl._M_rwlock + 0x20) = 0;
  (this->mutex)._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->mutex)._M_impl._M_rwlock + 0x30) = 0;
  (this->dataWrite).textureIdMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->dataWrite).textureIdMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->dataWrite).textureIdMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->dataWrite).textures._M_t._M_impl.super__Rb_tree_header;
  (this->dataWrite).textures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dataWrite).textures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->dataWrite).textures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->dataWrite).textures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->dataWrite).textures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->dataWrite).drawLists.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dataWrite).drawLists.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dataWrite).drawLists.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dataWrite).drawListsDiff.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dataWrite).drawListsDiff.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dataWrite).drawListsDiff.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->dataRead).textureIdMap._M_t._M_impl.super__Rb_tree_header;
  (this->dataRead).textureIdMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dataRead).textureIdMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->dataRead).textureIdMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->dataRead).textureIdMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->dataRead).textureIdMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->dataRead).textures._M_t._M_impl.super__Rb_tree_header;
  (this->dataRead).textures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dataRead).textures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->dataRead).textures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->dataRead).textures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  memset(&(this->dataRead).textures._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0x88);
  std::_Deque_base<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>::_M_initialize_map
            ((_Deque_base<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_> *)&this->events,0);
  *(undefined8 *)((long)&(this->events).mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->events).mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->events).mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->events).mutex.super___mutex_base._M_mutex + 8) = 0;
  (this->events).mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&(this->events).cv);
  Incppect<false>::Incppect();
  (this->handlerDisconnect).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->handlerDisconnect)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->handlerDisconnect).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->handlerDisconnect).super__Function_base._M_functor + 8) = 0;
  (this->handlerConnect).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->handlerConnect)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->handlerConnect).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->handlerConnect).super__Function_base._M_functor + 8) = 0;
  this_00 = (XorRlePerDrawListWithVtxOffset *)operator_new(0x58);
  ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::XorRlePerDrawListWithVtxOffset(this_00);
  (this->compressorDrawData)._M_t.
  super___uniq_ptr_impl<ImDrawDataCompressor::Interface,_std::default_delete<ImDrawDataCompressor::Interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_ImDrawDataCompressor::Interface_*,_std::default_delete<ImDrawDataCompressor::Interface>_>
  .super__Head_base<0UL,_ImDrawDataCompressor::Interface_*,_false>._M_head_impl =
       (Interface *)this_00;
  return;
}

Assistant:

Impl() : compressorDrawData(new ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset()) {}